

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomFourAction::Pick(BlueRoomFourAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  string *this_00;
  allocator local_51;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != WHITE_PILLAR) {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != BLACK_PILLAR) {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 != ROPE) {
        pAVar2 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
        return pAVar2;
      }
      pAVar2 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_50,
                 "You attempt to pickup the rope, but it appears to be attached to the floor in the middle of the room. There seems to be enough to extend toward each pillar."
                 ,&local_51);
      ActionResults::ActionResults(pAVar2,CURRENT,&local_50);
      this_00 = &local_50;
      goto LAB_00120c98;
    }
  }
  pAVar2 = (ActionResults *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_30,"You can\'t pick up that pillar!",&local_51);
  ActionResults::ActionResults(pAVar2,CURRENT,&local_30);
  this_00 = &local_30;
LAB_00120c98:
  std::__cxx11::string::~string((string *)this_00);
  return pAVar2;
}

Assistant:

ActionResults *BlueRoomFourAction::Pick() {

    if(commands->getMainItem() == WHITE_PILLAR || commands->getMainItem() == BLACK_PILLAR)
    {
        return new ActionResults(CURRENT,"You can't pick up that pillar!");
    } else if (commands->getMainItem() == ROPE){
        return new ActionResults(CURRENT, "You attempt to pickup the rope, but it appears to be attached to the floor in the middle of the room. "
                "There seems to be enough to extend toward each pillar.");
    } else {
        return AbstractRoomAction::Pick();
    }
}